

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_value_visit
          (BinBinaryWriter *this,Option *value)

{
  Value *pVVar1;
  bool bVar2;
  Category CVar3;
  ssize_t sVar4;
  size_t __n;
  void *__buf;
  char *msg;
  Value *item;
  Value *value_00;
  
  CVar3 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
          ::type_to_category(value->valueType);
  if (CVar3 - OPTION < 3) {
    msg = "!ValueHelper::is_container(value.valueType)\n";
  }
  else {
    __n = ((long)(value->items).
                 super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(value->items).
                 super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    if (__n < 2) {
      sVar4 = BinaryWriter::write(&this->writer,(uint)value->valueType,__buf,__n);
      if ((char)sVar4 != '\0') {
        BinaryWriter::write<unsigned_char>
                  (&this->writer,
                   (char)((uint)(*(int *)&(value->items).
                                          super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&(value->items).
                                         super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * '9');
        value_00 = &((value->items).
                     super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl
                     .super__Vector_impl_data._M_start)->value;
        pVVar1 = &((value->items).
                   super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl.
                   super__Vector_impl_data._M_finish)->value;
        while( true ) {
          if (value_00 == pVVar1) {
            return true;
          }
          bVar2 = write_value(this,value_00,value->valueType);
          if (!bVar2) break;
          value_00 = value_00 + 1;
        }
        bVar2 = fail_msg(this,"write_value(item, value.valueType)\n");
        return bVar2;
      }
      msg = "writer.write(value.valueType)\n";
    }
    else {
      msg = "value.items.size() <= 1\n";
    }
  }
  bVar2 = fail_msg(this,msg);
  return bVar2;
}

Assistant:

bool write_value_visit(Option const& value) noexcept {
            bin_assert(!ValueHelper::is_container(value.valueType));
            bin_assert(value.items.size() <= 1);
            bin_assert(writer.write(value.valueType));
            writer.write(static_cast<uint8_t>(value.items.size()));
            for (auto const& [item] : value.items) {
                bin_assert(write_value(item, value.valueType));
            }
            return true;
        }